

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveSpaceForPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          RayTracingPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  RenderDeviceVkImpl *this_00;
  GraphicsAdapterInfo *pGVar1;
  uint local_38;
  uint local_34;
  Uint32 i_2;
  Uint32 i_1;
  Uint32 i;
  Uint32 ShaderHandleSize;
  size_t RTDataSize;
  FixedLinearAllocator *MemPool_local;
  RayTracingPipelineStateCreateInfo *CreateInfo_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  this_00 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                       );
  pGVar1 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
  FixedLinearAllocator::AddSpace
            (MemPool,(ulong)(pGVar1->RayTracing).ShaderGroupHandleSize *
                     ((ulong)CreateInfo->GeneralShaderCount +
                      (ulong)CreateInfo->TriangleHitShaderCount +
                     (ulong)CreateInfo->ProceduralHitShaderCount) + 0x48,8);
  for (i_2 = 0; i_2 < CreateInfo->GeneralShaderCount; i_2 = i_2 + 1) {
    FixedLinearAllocator::AddSpaceForString(MemPool,CreateInfo->pGeneralShaders[i_2].Name,0);
  }
  for (local_34 = 0; local_34 < CreateInfo->TriangleHitShaderCount; local_34 = local_34 + 1) {
    FixedLinearAllocator::AddSpaceForString
              (MemPool,CreateInfo->pTriangleHitShaders[local_34].Name,0);
  }
  for (local_38 = 0; local_38 < CreateInfo->ProceduralHitShaderCount; local_38 = local_38 + 1) {
    FixedLinearAllocator::AddSpaceForString
              (MemPool,CreateInfo->pProceduralHitShaders[local_38].Name,0);
  }
  ReserveResourceLayout(&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,MemPool)
  ;
  ReserveResourceSignatures(this,&CreateInfo->super_PipelineStateCreateInfo,MemPool);
  return;
}

Assistant:

void ReserveSpaceForPipelineDesc(const RayTracingPipelineStateCreateInfo& CreateInfo,
                                     FixedLinearAllocator&                    MemPool) noexcept
    {
        size_t RTDataSize = sizeof(RayTracingPipelineData);
        // Reserve space for shader handles
        const Uint32 ShaderHandleSize = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        RTDataSize += size_t{ShaderHandleSize} *
            (size_t{CreateInfo.GeneralShaderCount} +
             size_t{CreateInfo.TriangleHitShaderCount} +
             size_t{CreateInfo.ProceduralHitShaderCount});
        // Extra bytes were reserved to avoid compiler errors on zero-sized arrays
        RTDataSize -= sizeof(RayTracingPipelineData::ShaderHandles);
        MemPool.AddSpace(RTDataSize, alignof(RayTracingPipelineData));

        for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
        {
            MemPool.AddSpaceForString(CreateInfo.pGeneralShaders[i].Name);
        }
        for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
        {
            MemPool.AddSpaceForString(CreateInfo.pTriangleHitShaders[i].Name);
        }
        for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
        {
            MemPool.AddSpaceForString(CreateInfo.pProceduralHitShaders[i].Name);
        }

        ReserveResourceLayout(CreateInfo.PSODesc.ResourceLayout, MemPool);
        ReserveResourceSignatures(CreateInfo, MemPool);
    }